

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float128 float128_div_mips64el(float128 a,float128 b,float_status *status)

{
  byte zSign;
  uint32_t bLow;
  ulong uVar1;
  uint64_t uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int32_t zExp;
  ulong uVar9;
  ulong uVar10;
  uint32_t aLow;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  bool bVar19;
  float128 fVar20;
  int32_t bExp;
  int32_t aExp;
  uint local_9c;
  ulong local_98;
  uint local_8c;
  ulong local_88;
  ulong local_80;
  uint64_t local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  float_status *local_48;
  uint64_t local_40;
  ulong local_38;
  
  uVar2 = a.low;
  local_78 = b.low;
  uVar16 = a.high & 0xffffffffffff;
  uVar8 = a.high._6_2_ & 0x7fff;
  local_70 = b.high & 0xffffffffffff;
  local_9c = b.high._6_2_ & 0x7fff;
  uVar14 = b.high ^ a.high;
  local_8c = uVar8;
  local_40 = uVar2;
  local_38 = uVar16;
  if (uVar8 == 0x7fff) {
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        uVar2 != 0) {
LAB_00921c55:
      fVar20 = propagateFloat128NaN(a,b,status);
      return fVar20;
    }
    if (local_9c != 0x7fff) {
LAB_00921e0f:
      uVar14 = uVar14 & 0x8000000000000000 | 0x7fff000000000000;
      uVar2 = 0;
      goto LAB_009221ac;
    }
    if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        local_78 != 0) goto LAB_00921c55;
LAB_00921e30:
    status->float_exception_flags = status->float_exception_flags | 1;
    uVar16 = 0x2000000000000000;
    if (status->snan_bit_is_one != '\0') {
      uVar16 = 0x1fffffffffffffff;
    }
    uVar2 = -(ulong)((uint)uVar16 & 1);
    uVar14 = uVar16 >> 0xe | 0x7fff000000000000;
  }
  else {
    if (((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          local_78 == 0) {
        if ((((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) != (undefined1  [16])0x0
            || uVar2 != 0) ||
            ((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0) {
          status->float_exception_flags = status->float_exception_flags | 4;
          goto LAB_00921e0f;
        }
        goto LAB_00921e30;
      }
      normalizeFloat128Subnormal(local_70,local_78,(int32_t *)&local_9c,&local_70,&local_78);
LAB_00921c94:
      local_48 = status;
      if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) != (undefined1  [16])0x0) {
LAB_00921ce9:
        uVar3 = uVar2 << 0xf;
        uVar17 = uVar16 << 0xf | uVar2 >> 0x31 | 0x8000000000000000;
        uVar11 = local_78 * 0x8000;
        uVar16 = local_70 << 0xf;
        local_80 = uVar16 | 0x8000000000000000;
        local_88 = local_78;
        local_98 = local_78 >> 0x31;
        uVar12 = local_98 | local_80;
        if ((uVar12 < uVar17) || (uVar11 <= uVar3 && uVar12 == uVar17)) {
          uVar17 = uVar17 >> 1;
          uVar3 = uVar3 >> 1 | (uVar2 >> 0x31) << 0x3f;
          zExp = (uVar8 - local_9c) + 0x3ffe;
        }
        else {
          zExp = (uVar8 - local_9c) + 0x3ffd;
        }
        local_58 = local_80 >> 0x20;
        if (uVar17 < uVar12) {
          uVar10 = uVar16 & 0xffffffff00000000 | 0x8000000000000000;
          uVar9 = 0xffffffff00000000;
          if (uVar17 < uVar10) {
            uVar9 = uVar17 / local_58 << 0x20;
          }
          local_98 = local_98 | uVar16 & 0xffffffff;
          uVar13 = (uVar9 >> 0x20) * local_98;
          uVar1 = uVar9 * uVar12;
          uVar6 = uVar3 - uVar1;
          lVar4 = ((uVar17 - ((uVar13 >> 0x20) + (uVar9 >> 0x20) * local_58)) -
                  (ulong)(uVar3 < uVar1)) - (ulong)(uVar1 < uVar13 << 0x20);
          if (lVar4 < 0) {
            uVar1 = (0x100000000 - uVar9) * uVar12 + uVar3;
            uVar13 = uVar6;
            do {
              uVar9 = uVar9 - 0x100000000;
              uVar6 = uVar13 + (uVar12 << 0x20);
              bVar19 = uVar1 < uVar13;
              uVar1 = uVar1 + (uVar12 << 0x20);
              lVar4 = lVar4 + local_58 + (ulong)bVar19;
              uVar13 = uVar6;
            } while (lVar4 < 0);
          }
          uVar6 = uVar6 >> 0x20 | lVar4 << 0x20;
          if (uVar6 < uVar10) {
            uVar6 = uVar6 / local_58;
          }
          else {
            uVar6 = 0xffffffff;
          }
          uVar6 = uVar6 | uVar9;
        }
        else {
          local_98 = local_98 | uVar16 & 0xffffffff;
          uVar6 = 0xffffffffffffffff;
        }
        local_60 = uVar11 >> 0x20;
        uVar1 = uVar6 >> 0x20;
        local_68 = uVar11 & 0xffffffff;
        uVar9 = (uVar6 & 0xffffffff) * local_60;
        lVar18 = 0;
        uVar10 = uVar9 + uVar1 * local_68;
        lVar4 = 0;
        if (CARRY8(uVar9,uVar1 * local_68)) {
          lVar4 = 0x100000000;
        }
        uVar9 = uVar6 * uVar11;
        uVar13 = (uVar6 & 0xffffffff) * local_58;
        uVar7 = uVar13 + uVar1 * local_98;
        if (CARRY8(uVar13,uVar1 * local_98)) {
          lVar18 = -0x100000000;
        }
        uVar5 = uVar6 * uVar12;
        uVar15 = uVar1 * local_60 + uVar5 + (uVar10 >> 0x20) + lVar4 +
                 (ulong)(uVar9 < uVar10 << 0x20);
        uVar10 = -uVar9;
        uVar13 = (uVar3 - uVar15) - (ulong)(uVar9 != 0);
        lVar4 = (((((uVar17 - ((uVar7 >> 0x20) + uVar1 * local_58)) + lVar18) -
                  (ulong)(uVar5 < uVar7 << 0x20)) - (ulong)(uVar15 < uVar5)) -
                (ulong)(uVar3 < uVar15)) - (ulong)(uVar3 - uVar15 < (ulong)(uVar9 != 0));
        if (lVar4 < 0) {
          uVar3 = (uVar6 * -0x8000 + 0x8000) * local_78;
          do {
            uVar6 = uVar6 - 1;
            bVar19 = CARRY8(uVar13,uVar12);
            uVar17 = uVar13 + uVar12;
            uVar13 = uVar17 + (uVar3 < uVar10);
            lVar4 = lVar4 + (ulong)bVar19 + (ulong)CARRY8(uVar17,(ulong)(uVar3 < uVar10));
            uVar10 = uVar10 + uVar11;
            uVar3 = uVar3 + uVar11;
          } while (lVar4 < 0);
        }
        uVar3 = 0xffffffffffffffff;
        if (uVar13 < uVar12) {
          uVar3 = 0xffffffff00000000;
          uVar16 = uVar16 & 0xffffffff00000000 | 0x8000000000000000;
          if (uVar13 < uVar16) {
            uVar3 = uVar13 / local_58 << 0x20;
          }
          uVar1 = (uVar3 >> 0x20) * local_98;
          uVar9 = uVar3 * uVar12;
          uVar17 = uVar10 - uVar9;
          lVar4 = ((uVar13 - ((uVar1 >> 0x20) + (uVar3 >> 0x20) * local_58)) -
                  (ulong)(uVar10 < uVar9)) - (ulong)(uVar9 < uVar1 << 0x20);
          if (lVar4 < 0) {
            uVar9 = (0x100000000 - uVar3) * uVar12 + uVar10;
            uVar1 = uVar17;
            do {
              uVar3 = uVar3 - 0x100000000;
              uVar17 = uVar1 + (uVar12 << 0x20);
              bVar19 = uVar9 < uVar1;
              uVar9 = uVar9 + (uVar12 << 0x20);
              lVar4 = lVar4 + local_58 + (ulong)bVar19;
              uVar1 = uVar17;
            } while (lVar4 < 0);
          }
          uVar17 = uVar17 >> 0x20 | lVar4 << 0x20;
          if (uVar17 < uVar16) {
            uVar17 = uVar17 / local_58;
          }
          else {
            uVar17 = 0xffffffff;
          }
          uVar3 = uVar17 | uVar3;
          if (((uint)uVar17 & 0x3fff) < 5) {
            uVar16 = uVar3 >> 0x20;
            uVar9 = (uVar17 & 0xffffffff) * local_60;
            uVar1 = uVar9 + local_68 * uVar16;
            lVar4 = 0x100000000;
            if (!CARRY8(uVar9,local_68 * uVar16)) {
              lVar4 = 0;
            }
            uVar9 = (uVar17 & 0xffffffff) * local_58;
            uVar17 = uVar3 * uVar11;
            uVar7 = uVar9 + local_98 * uVar16;
            lVar18 = -0x100000000;
            if (!CARRY8(uVar9,local_98 * uVar16)) {
              lVar18 = 0;
            }
            uVar5 = uVar3 * uVar12;
            uVar1 = local_60 * uVar16 + uVar5 + (uVar1 >> 0x20) + lVar4 +
                    (ulong)(uVar17 < uVar1 << 0x20);
            uVar9 = -uVar17;
            uVar15 = (uVar10 - uVar1) - (ulong)(uVar17 != 0);
            lVar4 = (((((uVar13 - ((uVar7 >> 0x20) + uVar16 * local_58)) + lVar18) -
                      (ulong)(uVar5 < uVar7 << 0x20)) - (ulong)(uVar1 < uVar5)) -
                    (ulong)(uVar10 < uVar1)) - (ulong)(uVar10 - uVar1 < (ulong)(uVar17 != 0));
            if (lVar4 < 0) {
              uVar16 = local_78 * (uVar3 * -0x8000 + 0x8000);
              do {
                uVar3 = uVar3 - 1;
                bVar19 = CARRY8(uVar15,uVar12);
                uVar17 = uVar15 + uVar12;
                uVar15 = uVar17 + (uVar16 < uVar9);
                lVar4 = lVar4 + (ulong)bVar19 + (ulong)CARRY8(uVar17,(ulong)(uVar16 < uVar9));
                uVar9 = uVar9 + uVar11;
                uVar16 = uVar16 + uVar11;
              } while (lVar4 < 0);
            }
            uVar3 = uVar3 | ((lVar4 != 0 || uVar15 != 0) || uVar9 != 0);
          }
        }
        local_50._0_1_ = (byte)(uVar14 >> 0x3f);
        zSign = (byte)local_50;
        local_50 = uVar14 >> 0x3f;
        fVar20 = roundAndPackFloat128
                           (zSign,zExp,uVar6 >> 0xf,uVar6 << 0x31 | uVar3 >> 0xf,uVar3 << 0x31,
                            local_48);
        return fVar20;
      }
      if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
          uVar2 != 0) {
        normalizeFloat128Subnormal(uVar16,uVar2,(int32_t *)&local_8c,&local_38,&local_40);
        uVar16 = local_38;
        uVar2 = local_40;
        uVar8 = local_8c;
        goto LAB_00921ce9;
      }
    }
    else {
      if (local_9c != 0x7fff) goto LAB_00921c94;
      if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
          local_78 != 0) goto LAB_00921c55;
    }
    uVar14 = uVar14 & 0x8000000000000000;
    uVar2 = 0;
  }
LAB_009221ac:
  fVar20.high = uVar14;
  fVar20.low = uVar2;
  return fVar20;
}

Assistant:

float128 float128_div(float128 a, float128 b, float_status *status)
{
    flag aSign, bSign, zSign;
    int32_t aExp, bExp, zExp;
    uint64_t aSig0, aSig1, bSig0, bSig1, zSig0, zSig1, zSig2;
    uint64_t rem0, rem1, rem2, rem3, term0, term1, term2, term3;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    bSign = extractFloat128Sign( b );
    zSign = aSign ^ bSign;
    if ( aExp == 0x7FFF ) {
        if (aSig0 | aSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        if ( bExp == 0x7FFF ) {
            if (bSig0 | bSig1) {
                return propagateFloat128NaN(a, b, status);
            }
            goto invalid;
        }
        return packFloat128( zSign, 0x7FFF, 0, 0 );
    }
    if ( bExp == 0x7FFF ) {
        if (bSig0 | bSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        return packFloat128( zSign, 0, 0, 0 );
    }
    if ( bExp == 0 ) {
        if ( ( bSig0 | bSig1 ) == 0 ) {
            if ( ( aExp | aSig0 | aSig1 ) == 0 ) {
 invalid:
                float_raise(float_flag_invalid, status);
                return float128_default_nan(status);
            }
            float_raise(float_flag_divbyzero, status);
            return packFloat128( zSign, 0x7FFF, 0, 0 );
        }
        normalizeFloat128Subnormal( bSig0, bSig1, &bExp, &bSig0, &bSig1 );
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return packFloat128( zSign, 0, 0, 0 );
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    zExp = aExp - bExp + 0x3FFD;
    shortShift128Left(
        aSig0 | UINT64_C(0x0001000000000000), aSig1, 15, &aSig0, &aSig1 );
    shortShift128Left(
        bSig0 | UINT64_C(0x0001000000000000), bSig1, 15, &bSig0, &bSig1 );
    if ( le128( bSig0, bSig1, aSig0, aSig1 ) ) {
        shift128Right( aSig0, aSig1, 1, &aSig0, &aSig1 );
        ++zExp;
    }
    zSig0 = estimateDiv128To64( aSig0, aSig1, bSig0 );
    mul128By64To192( bSig0, bSig1, zSig0, &term0, &term1, &term2 );
    sub192( aSig0, aSig1, 0, term0, term1, term2, &rem0, &rem1, &rem2 );
    while ( (int64_t) rem0 < 0 ) {
        --zSig0;
        add192( rem0, rem1, rem2, 0, bSig0, bSig1, &rem0, &rem1, &rem2 );
    }
    zSig1 = estimateDiv128To64( rem1, rem2, bSig0 );
    if ( ( zSig1 & 0x3FFF ) <= 4 ) {
        mul128By64To192( bSig0, bSig1, zSig1, &term1, &term2, &term3 );
        sub192( rem1, rem2, 0, term1, term2, term3, &rem1, &rem2, &rem3 );
        while ( (int64_t) rem1 < 0 ) {
            --zSig1;
            add192( rem1, rem2, rem3, 0, bSig0, bSig1, &rem1, &rem2, &rem3 );
        }
        zSig1 |= ( ( rem1 | rem2 | rem3 ) != 0 );
    }
    shift128ExtraRightJamming( zSig0, zSig1, 0, 15, &zSig0, &zSig1, &zSig2 );
    return roundAndPackFloat128(zSign, zExp, zSig0, zSig1, zSig2, status);

}